

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Comm_spawn(char *command,char **argv,int maxprocs,MPIABI_Info info,int root,
                     MPIABI_Comm comm,MPIABI_Comm *intercomm,int *array_off_errcodes)

{
  int iVar1;
  
  iVar1 = MPI_Comm_spawn();
  return iVar1;
}

Assistant:

int MPIABI_Comm_spawn(
  const char * command,
  char ** argv,
  int maxprocs,
  MPIABI_Info info,
  int root,
  MPIABI_Comm comm,
  MPIABI_Comm * intercomm,
  int * array_off_errcodes
) {
  return MPI_Comm_spawn(
    command,
    argv,
    maxprocs,
    (MPI_Info)(WPI_Info)info,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Comm *)(WPI_CommPtr)intercomm,
    array_off_errcodes
  );
}